

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_playback_one_page(Pager *pPager,i64 *pOffset,Bitvec *pDone,int isMainJrnl,int isSavepnt)

{
  u8 *aData_00;
  long lVar1;
  void *__dest;
  int iVar2;
  u32 uVar3;
  bool bVar4;
  sqlite3_file *local_78;
  void *pData;
  i64 ofst;
  int isSynced;
  sqlite3_file *jfd;
  char *aData;
  u32 cksum;
  Pgno pgno;
  PgHdr *pPg;
  int local_30;
  int rc;
  int isSavepnt_local;
  int isMainJrnl_local;
  Bitvec *pDone_local;
  i64 *pOffset_local;
  Pager *pPager_local;
  
  aData_00 = (u8 *)pPager->pTmpSpace;
  if (isMainJrnl == 0) {
    local_78 = pPager->sjfd;
  }
  else {
    local_78 = pPager->jfd;
  }
  local_30 = isSavepnt;
  rc = isMainJrnl;
  _isSavepnt_local = pDone;
  pDone_local = (Bitvec *)pOffset;
  pOffset_local = (i64 *)pPager;
  pPg._4_4_ = read32bits(local_78,*pOffset,(u32 *)((long)&aData + 4));
  pPager_local._4_4_ = pPg._4_4_;
  if ((pPg._4_4_ == 0) &&
     (pPg._4_4_ = sqlite3OsRead(local_78,aData_00,*(int *)((long)pOffset_local + 0xbc),
                                *(long *)pDone_local + 4), pPager_local._4_4_ = pPg._4_4_,
     pPg._4_4_ == 0)) {
    *(long *)pDone_local =
         (long)(*(int *)((long)pOffset_local + 0xbc) + 4 + rc * 4) + *(long *)pDone_local;
    if ((aData._4_4_ == 0) ||
       (aData._4_4_ == sqlite3PendingByte / *(int *)((long)pOffset_local + 0xbc) + 1U)) {
      pPager_local._4_4_ = 0x65;
    }
    else if ((*(uint *)((long)pOffset_local + 0x1c) < aData._4_4_) ||
            (iVar2 = sqlite3BitvecTest(_isSavepnt_local,aData._4_4_), iVar2 != 0)) {
      pPager_local._4_4_ = 0;
    }
    else {
      if (rc != 0) {
        pPg._4_4_ = read32bits(local_78,*(long *)pDone_local + -4,(u32 *)&aData);
        if (pPg._4_4_ != 0) {
          return pPg._4_4_;
        }
        if ((local_30 == 0) &&
           (uVar3 = pager_cksum((Pager *)pOffset_local,aData_00), uVar3 != (u32)aData)) {
          return 0x65;
        }
      }
      if ((_isSavepnt_local == (Bitvec *)0x0) ||
         (pPg._4_4_ = sqlite3BitvecSet(_isSavepnt_local,aData._4_4_), pPager_local._4_4_ = pPg._4_4_
         , pPg._4_4_ == 0)) {
        if ((aData._4_4_ == 1) &&
           (*(ushort *)((long)pOffset_local + 0xb2) != (ushort)aData_00[0x14])) {
          *(ushort *)((long)pOffset_local + 0xb2) = (ushort)aData_00[0x14];
        }
        if (pOffset_local[0x24] == 0) {
          _cksum = sqlite3PagerLookup((Pager *)pOffset_local,aData._4_4_);
        }
        else {
          _cksum = (DbPage *)0x0;
        }
        if (rc == 0) {
          bVar4 = true;
          if (_cksum != (DbPage *)0x0) {
            bVar4 = (_cksum->flags & 8) == 0;
          }
        }
        else {
          bVar4 = true;
          if (*(char *)((long)pOffset_local + 0xb) == '\0') {
            lVar1._0_4_ = pDone_local->iSize;
            lVar1._4_4_ = pDone_local->nSet;
            bVar4 = lVar1 <= pOffset_local[0xd];
          }
        }
        if ((*(long *)pOffset_local[9] == 0) ||
           (((*(byte *)((long)pOffset_local + 0x14) < 4 &&
             (*(char *)((long)pOffset_local + 0x14) != '\0')) || (!bVar4)))) {
          if ((rc == 0) && (_cksum == (DbPage *)0x0)) {
            *(byte *)(pOffset_local + 3) = *(byte *)(pOffset_local + 3) | 2;
            pPg._4_4_ = sqlite3PagerGet((Pager *)pOffset_local,aData._4_4_,(DbPage **)&cksum,1);
            *(byte *)(pOffset_local + 3) = *(byte *)(pOffset_local + 3) & 0xfd;
            if (pPg._4_4_ != 0) {
              return pPg._4_4_;
            }
            sqlite3PcacheMakeDirty(_cksum);
          }
        }
        else {
          pPg._4_4_ = sqlite3OsWrite((sqlite3_file *)pOffset_local[9],aData_00,
                                     *(int *)((long)pOffset_local + 0xbc),
                                     (ulong)(aData._4_4_ - 1) *
                                     (long)*(int *)((long)pOffset_local + 0xbc));
          if (*(uint *)((long)pOffset_local + 0x24) < aData._4_4_) {
            *(uint *)((long)pOffset_local + 0x24) = aData._4_4_;
          }
          if (pOffset_local[0xe] != 0) {
            sqlite3BackupUpdate((sqlite3_backup *)pOffset_local[0xe],aData._4_4_,aData_00);
          }
        }
        if (_cksum != (DbPage *)0x0) {
          __dest = _cksum->pData;
          memcpy(__dest,aData_00,(long)*(int *)((long)pOffset_local + 0xbc));
          (*(code *)pOffset_local[0x20])(_cksum);
          if (aData._4_4_ == 1) {
            pOffset_local[0x11] = *(i64 *)((long)__dest + 0x18);
            pOffset_local[0x12] = *(i64 *)((long)__dest + 0x20);
          }
          sqlite3PcacheRelease(_cksum);
        }
        pPager_local._4_4_ = pPg._4_4_;
      }
    }
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_playback_one_page(
  Pager *pPager,                /* The pager being played back */
  i64 *pOffset,                 /* Offset of record to playback */
  Bitvec *pDone,                /* Bitvec of pages already played back */
  int isMainJrnl,               /* 1 -> main journal. 0 -> sub-journal. */
  int isSavepnt                 /* True for a savepoint rollback */
){
  int rc;
  PgHdr *pPg;                   /* An existing page in the cache */
  Pgno pgno;                    /* The page number of a page in journal */
  u32 cksum;                    /* Checksum used for sanity checking */
  char *aData;                  /* Temporary storage for the page */
  sqlite3_file *jfd;            /* The file descriptor for the journal file */
  int isSynced;                 /* True if journal page is synced */
#ifdef SQLITE_HAS_CODEC
  /* The jrnlEnc flag is true if Journal pages should be passed through
  ** the codec.  It is false for pure in-memory journals. */
  const int jrnlEnc = (isMainJrnl || pPager->subjInMemory==0);
#endif

  assert( (isMainJrnl&~1)==0 );      /* isMainJrnl is 0 or 1 */
  assert( (isSavepnt&~1)==0 );       /* isSavepnt is 0 or 1 */
  assert( isMainJrnl || pDone );     /* pDone always used on sub-journals */
  assert( isSavepnt || pDone==0 );   /* pDone never used on non-savepoint */

  aData = pPager->pTmpSpace;
  assert( aData );         /* Temp storage must have already been allocated */
  assert( pagerUseWal(pPager)==0 || (!isMainJrnl && isSavepnt) );

  /* Either the state is greater than PAGER_WRITER_CACHEMOD (a transaction 
  ** or savepoint rollback done at the request of the caller) or this is
  ** a hot-journal rollback. If it is a hot-journal rollback, the pager
  ** is in state OPEN and holds an EXCLUSIVE lock. Hot-journal rollback
  ** only reads from the main journal, not the sub-journal.
  */
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD
       || (pPager->eState==PAGER_OPEN && pPager->eLock==EXCLUSIVE_LOCK)
  );
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD || isMainJrnl );

  /* Read the page number and page data from the journal or sub-journal
  ** file. Return an error code to the caller if an IO error occurs.
  */
  jfd = isMainJrnl ? pPager->jfd : pPager->sjfd;
  rc = read32bits(jfd, *pOffset, &pgno);
  if( rc!=SQLITE_OK ) return rc;
  rc = sqlite3OsRead(jfd, (u8*)aData, pPager->pageSize, (*pOffset)+4);
  if( rc!=SQLITE_OK ) return rc;
  *pOffset += pPager->pageSize + 4 + isMainJrnl*4;

  /* Sanity checking on the page.  This is more important that I originally
  ** thought.  If a power failure occurs while the journal is being written,
  ** it could cause invalid data to be written into the journal.  We need to
  ** detect this invalid data (with high probability) and ignore it.
  */
  if( pgno==0 || pgno==PAGER_MJ_PGNO(pPager) ){
    assert( !isSavepnt );
    return SQLITE_DONE;
  }
  if( pgno>(Pgno)pPager->dbSize || sqlite3BitvecTest(pDone, pgno) ){
    return SQLITE_OK;
  }
  if( isMainJrnl ){
    rc = read32bits(jfd, (*pOffset)-4, &cksum);
    if( rc ) return rc;
    if( !isSavepnt && pager_cksum(pPager, (u8*)aData)!=cksum ){
      return SQLITE_DONE;
    }
  }

  /* If this page has already been played back before during the current
  ** rollback, then don't bother to play it back again.
  */
  if( pDone && (rc = sqlite3BitvecSet(pDone, pgno))!=SQLITE_OK ){
    return rc;
  }

  /* When playing back page 1, restore the nReserve setting
  */
  if( pgno==1 && pPager->nReserve!=((u8*)aData)[20] ){
    pPager->nReserve = ((u8*)aData)[20];
    pagerReportSize(pPager);
  }

  /* If the pager is in CACHEMOD state, then there must be a copy of this
  ** page in the pager cache. In this case just update the pager cache,
  ** not the database file. The page is left marked dirty in this case.
  **
  ** An exception to the above rule: If the database is in no-sync mode
  ** and a page is moved during an incremental vacuum then the page may
  ** not be in the pager cache. Later: if a malloc() or IO error occurs
  ** during a Movepage() call, then the page may not be in the cache
  ** either. So the condition described in the above paragraph is not
  ** assert()able.
  **
  ** If in WRITER_DBMOD, WRITER_FINISHED or OPEN state, then we update the
  ** pager cache if it exists and the main file. The page is then marked 
  ** not dirty. Since this code is only executed in PAGER_OPEN state for
  ** a hot-journal rollback, it is guaranteed that the page-cache is empty
  ** if the pager is in OPEN state.
  **
  ** Ticket #1171:  The statement journal might contain page content that is
  ** different from the page content at the start of the transaction.
  ** This occurs when a page is changed prior to the start of a statement
  ** then changed again within the statement.  When rolling back such a
  ** statement we must not write to the original database unless we know
  ** for certain that original page contents are synced into the main rollback
  ** journal.  Otherwise, a power loss might leave modified data in the
  ** database file without an entry in the rollback journal that can
  ** restore the database to its original form.  Two conditions must be
  ** met before writing to the database files. (1) the database must be
  ** locked.  (2) we know that the original page content is fully synced
  ** in the main journal either because the page is not in cache or else
  ** the page is marked as needSync==0.
  **
  ** 2008-04-14:  When attempting to vacuum a corrupt database file, it
  ** is possible to fail a statement on a database that does not yet exist.
  ** Do not attempt to write if database file has never been opened.
  */
  if( pagerUseWal(pPager) ){
    pPg = 0;
  }else{
    pPg = sqlite3PagerLookup(pPager, pgno);
  }
  assert( pPg || !MEMDB );
  assert( pPager->eState!=PAGER_OPEN || pPg==0 || pPager->tempFile );
  PAGERTRACE(("PLAYBACK %d page %d hash(%08x) %s\n",
           PAGERID(pPager), pgno, pager_datahash(pPager->pageSize, (u8*)aData),
           (isMainJrnl?"main-journal":"sub-journal")
  ));
  if( isMainJrnl ){
    isSynced = pPager->noSync || (*pOffset <= pPager->journalHdr);
  }else{
    isSynced = (pPg==0 || 0==(pPg->flags & PGHDR_NEED_SYNC));
  }
  if( isOpen(pPager->fd)
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
   && isSynced
  ){
    i64 ofst = (pgno-1)*(i64)pPager->pageSize;
    testcase( !isSavepnt && pPg!=0 && (pPg->flags&PGHDR_NEED_SYNC)!=0 );
    assert( !pagerUseWal(pPager) );

    /* Write the data read from the journal back into the database file.
    ** This is usually safe even for an encrypted database - as the data
    ** was encrypted before it was written to the journal file. The exception
    ** is if the data was just read from an in-memory sub-journal. In that
    ** case it must be encrypted here before it is copied into the database
    ** file.  */
#ifdef SQLITE_HAS_CODEC
    if( !jrnlEnc ){
      CODEC2(pPager, aData, pgno, 7, rc=SQLITE_NOMEM_BKPT, aData);
      rc = sqlite3OsWrite(pPager->fd, (u8 *)aData, pPager->pageSize, ofst);
      CODEC1(pPager, aData, pgno, 3, rc=SQLITE_NOMEM_BKPT);
    }else
#endif
    rc = sqlite3OsWrite(pPager->fd, (u8 *)aData, pPager->pageSize, ofst);

    if( pgno>pPager->dbFileSize ){
      pPager->dbFileSize = pgno;
    }
    if( pPager->pBackup ){
#ifdef SQLITE_HAS_CODEC
      if( jrnlEnc ){
        CODEC1(pPager, aData, pgno, 3, rc=SQLITE_NOMEM_BKPT);
        sqlite3BackupUpdate(pPager->pBackup, pgno, (u8*)aData);
        CODEC2(pPager, aData, pgno, 7, rc=SQLITE_NOMEM_BKPT,aData);
      }else
#endif
      sqlite3BackupUpdate(pPager->pBackup, pgno, (u8*)aData);
    }
  }else if( !isMainJrnl && pPg==0 ){
    /* If this is a rollback of a savepoint and data was not written to
    ** the database and the page is not in-memory, there is a potential
    ** problem. When the page is next fetched by the b-tree layer, it 
    ** will be read from the database file, which may or may not be 
    ** current. 
    **
    ** There are a couple of different ways this can happen. All are quite
    ** obscure. When running in synchronous mode, this can only happen 
    ** if the page is on the free-list at the start of the transaction, then
    ** populated, then moved using sqlite3PagerMovepage().
    **
    ** The solution is to add an in-memory page to the cache containing
    ** the data just read from the sub-journal. Mark the page as dirty 
    ** and if the pager requires a journal-sync, then mark the page as 
    ** requiring a journal-sync before it is written.
    */
    assert( isSavepnt );
    assert( (pPager->doNotSpill & SPILLFLAG_ROLLBACK)==0 );
    pPager->doNotSpill |= SPILLFLAG_ROLLBACK;
    rc = sqlite3PagerGet(pPager, pgno, &pPg, 1);
    assert( (pPager->doNotSpill & SPILLFLAG_ROLLBACK)!=0 );
    pPager->doNotSpill &= ~SPILLFLAG_ROLLBACK;
    if( rc!=SQLITE_OK ) return rc;
    sqlite3PcacheMakeDirty(pPg);
  }
  if( pPg ){
    /* No page should ever be explicitly rolled back that is in use, except
    ** for page 1 which is held in use in order to keep the lock on the
    ** database active. However such a page may be rolled back as a result
    ** of an internal error resulting in an automatic call to
    ** sqlite3PagerRollback().
    */
    void *pData;
    pData = pPg->pData;
    memcpy(pData, (u8*)aData, pPager->pageSize);
    pPager->xReiniter(pPg);
    /* It used to be that sqlite3PcacheMakeClean(pPg) was called here.  But
    ** that call was dangerous and had no detectable benefit since the cache
    ** is normally cleaned by sqlite3PcacheCleanAll() after rollback and so
    ** has been removed. */
    pager_set_pagehash(pPg);

    /* If this was page 1, then restore the value of Pager.dbFileVers.
    ** Do this before any decoding. */
    if( pgno==1 ){
      memcpy(&pPager->dbFileVers, &((u8*)pData)[24],sizeof(pPager->dbFileVers));
    }

    /* Decode the page just read from disk */
#if SQLITE_HAS_CODEC
    if( jrnlEnc ){ CODEC1(pPager, pData, pPg->pgno, 3, rc=SQLITE_NOMEM_BKPT); }
#endif
    sqlite3PcacheRelease(pPg);
  }
  return rc;
}